

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_barrierback_(lua_State *L,GCObject *o)

{
  byte bVar1;
  global_State *pgVar2;
  GCObject **pnext;
  
  bVar1 = o->marked;
  if (((bVar1 & 0x20) != 0) && (pgVar2 = L->l_G, ((pgVar2->currentwhite ^ 0x18) & bVar1) == 0)) {
    if ((pgVar2->gckind != '\x01') == ((bVar1 & 7) != 5 && 1 < (bVar1 & 7))) {
      __assert_fail("(g->gckind == 1) == ((((o)->marked & 7) > 1) && ((o)->marked & 7) != 5)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x140,"void luaC_barrierback_(lua_State *, GCObject *)");
    }
    if ((bVar1 & 7) == 6) {
      o->marked = bVar1 & 0xc6;
    }
    else {
      if (9 < (o->tt & 0xe)) {
        __assert_fail("(((o)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x144,"void luaC_barrierback_(lua_State *, GCObject *)");
      }
      pnext = getgclist(o);
      linkgclist_(o,pnext,&pgVar2->grayagain);
    }
    if ((o->marked & 6) != 0) {
      o->marked = o->marked & 0xf8 | 5;
    }
    return;
  }
  __assert_fail("(((o)->marked) & ((1<<(5)))) && !(((o)->marked) & (((g)->currentwhite ^ ((1<<(3)) | (1<<(4))))))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                ,0x13f,"void luaC_barrierback_(lua_State *, GCObject *)");
}

Assistant:

void luaC_barrierback_ (lua_State *L, GCObject *o) {
  global_State *g = G(L);
  lua_assert(isblack(o) && !isdead(g, o));
  lua_assert((g->gckind == KGC_GEN) == (isold(o) && getage(o) != G_TOUCHED1));
  if (getage(o) == G_TOUCHED2)  /* already in gray list? */
    set2gray(o);  /* make it gray to become touched1 */
  else  /* link it in 'grayagain' and paint it gray */
    linkobjgclist(o, g->grayagain);
  if (isold(o))  /* generational mode? */
    setage(o, G_TOUCHED1);  /* touched in current cycle */
}